

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O2

uint * Corrade::Containers::Implementation::
       arrayGrowBy<unsigned_int,Corrade::Containers::ArrayMallocAllocator<unsigned_int>>
                 (Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *array,size_t count)

{
  unsigned_long tmp;
  uint *puVar1;
  size_t sVar2;
  size_t capacity;
  Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> local_38;
  
  if (count == 0) {
    puVar1 = array->_data + array->_size;
  }
  else {
    sVar2 = array->_size + count;
    if (array->_deleter == ArrayMallocAllocator<unsigned_int>::deleter) {
      if (*(long *)(array->_data + -2) - 8U >> 2 < sVar2) {
        sVar2 = ArrayMallocAllocator<unsigned_int>::grow(array->_data,sVar2);
        ArrayMallocAllocator<unsigned_int>::reallocate(&array->_data,array->_size,sVar2);
      }
    }
    else {
      capacity = 2;
      if (2 < sVar2) {
        capacity = sVar2;
      }
      puVar1 = ArrayMallocAllocator<unsigned_int>::allocate(capacity);
      if (array->_size == 0) {
        local_38._size = 0;
      }
      else {
        memcpy(puVar1,array->_data,array->_size << 2);
        local_38._size = array->_size;
      }
      local_38._data = array->_data;
      array->_data = puVar1;
      local_38._deleter = array->_deleter;
      array->_deleter = ArrayMallocAllocator<unsigned_int>::deleter;
      Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>::~Array(&local_38);
    }
    puVar1 = array->_data + array->_size;
    array->_size = count + array->_size;
  }
  return puVar1;
}

Assistant:

T* arrayGrowBy(Array<T>& array, const std::size_t count) {
    /* Direct access & caching to speed up debug builds */
    auto& arrayGuts = reinterpret_cast<Implementation::ArrayGuts<T>&>(array);

    /* No values to add, early exit */
    if(!count)
        return arrayGuts.data + arrayGuts.size;

    /* For arrays with an unknown deleter we'll always copy-allocate to a new
       place. Not using reallocate() as we don't know where the original memory
       comes from. */
    const std::size_t desiredCapacity = arrayGuts.size + count;
    std::size_t capacity;
    #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
    T* oldMid = nullptr;
    #endif
    if(arrayGuts.deleter != Allocator::deleter) {
        capacity = Allocator::grow(nullptr, desiredCapacity);
        T* const newArray = Allocator::allocate(capacity);
        arrayMoveConstruct<T>(arrayGuts.data, newArray, arrayGuts.size);
        array = Array<T>{newArray, arrayGuts.size, Allocator::deleter};

    /* Otherwise, if there's no space anymore, reallocate, which might be able
       to grow in-place */
    } else {
        capacity = Allocator::capacity(arrayGuts.data);
        if(arrayGuts.size + count > capacity) {
            capacity = Allocator::grow(arrayGuts.data, desiredCapacity);
            Allocator::reallocate(arrayGuts.data, arrayGuts.size, capacity);
        } else {
            #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
            oldMid = arrayGuts.data + arrayGuts.size;
            #endif
        }
    }

    /* Increase array size and return the previous end pointer */
    T* const it = arrayGuts.data + arrayGuts.size;
    #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
    __sanitizer_annotate_contiguous_container(
        Allocator::base(arrayGuts.data),
        arrayGuts.data + capacity,
        /* For a new allocation, ASan assumes the previous middle pointer is at
           the end of the array. If we grew an existing allocation, the
           previous middle is set what __sanitier_acc() received as a middle
           value before */
        /** @todo with std::realloc possibly happening in reallocate(), is that
            really a new allocation? what should I do there? */
        oldMid ? oldMid : arrayGuts.data + capacity,
        arrayGuts.data + arrayGuts.size + count);
    #endif
    arrayGuts.size += count;
    return it;
}